

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_framing.c
# Opt level: O2

amqp_boolean_t amqp_constant_is_hard_error(int constantNumber)

{
  if ((((0x28 < constantNumber - 0x1f5U) ||
       ((0x1802000003fU >> ((ulong)(constantNumber - 0x1f5U) & 0x3f) & 1) == 0)) &&
      (constantNumber != 0x140)) && (constantNumber != 0x192)) {
    return 0;
  }
  return 1;
}

Assistant:

amqp_boolean_t amqp_constant_is_hard_error(int constantNumber) {
  switch (constantNumber) {
    case AMQP_CONNECTION_FORCED:
      return 1;
    case AMQP_INVALID_PATH:
      return 1;
    case AMQP_FRAME_ERROR:
      return 1;
    case AMQP_SYNTAX_ERROR:
      return 1;
    case AMQP_COMMAND_INVALID:
      return 1;
    case AMQP_CHANNEL_ERROR:
      return 1;
    case AMQP_UNEXPECTED_FRAME:
      return 1;
    case AMQP_RESOURCE_ERROR:
      return 1;
    case AMQP_NOT_ALLOWED:
      return 1;
    case AMQP_NOT_IMPLEMENTED:
      return 1;
    case AMQP_INTERNAL_ERROR:
      return 1;
    default:
      return 0;
  }
}